

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O2

void __thiscall
wasm::LocalSubtyping::doWalkFunction(wasm::Function*)::Scanner::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  reference rVar1;
  LocalSet *local_20;
  LocalSet *curr_local;
  
  local_20 = curr;
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)((long)this + 0xd8),(ulong)curr->index);
  if ((*rVar1._M_p & rVar1._M_mask) != 0) {
    std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
              ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
               ((ulong)curr->index * 0x18 + *(long *)((long)this + 0x100)),&local_20);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        if (relevant[curr->index]) {
          setsForLocal[curr->index].push_back(curr);
        }
      }